

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

void __thiscall
boost::ext::ut::v1_1_8::
runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16>::~runner
          (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *this)

{
  byte bVar1;
  bool should_run;
  runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *this_local;
  
  bVar1 = (this->run_ ^ 0xffU) & 1;
  if (bVar1 != 0) {
    run(this,(run_cfg)0x0);
  }
  if ((this->dry_run_ & 1U) == 0) {
    reporter<boost::ext::ut::v1_1_8::printer>::on(&this->reporter_);
  }
  if ((bVar1 != 0) && (this->fails_ != 0)) {
    exit(-1);
  }
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&this->tag_);
  filter::~filter(&this->filter_);
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::~vector(&this->suites_);
  reporter<boost::ext::ut::v1_1_8::printer>::~reporter(&this->reporter_);
  return;
}

Assistant:

~runner() {
      const auto should_run = not run_;

      if (should_run) {
        static_cast<void>(run());
      }

      if (not dry_run_) {
        reporter_.on(events::summary{});
      }

      if (should_run and fails_) {
        std::exit(-1);
      }
    }